

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::detail::ClassSpecializationKey&,slang::ast::ClassType*&>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::ast::detail::ClassSpecializationHasher,std::equal_to<slang::ast::detail::ClassSpecializationKey>,std::allocator<std::pair<slang::ast::detail::ClassSpecializationKey_const,slang::ast::Type_const*>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          ClassSpecializationKey *args_1,ClassType **args_2)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  ulong uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  uint uVar6;
  ushort uVar7;
  byte bVar8;
  pointer ppCVar9;
  size_t sVar10;
  size_t sVar11;
  long lVar12;
  undefined1 auVar13 [16];
  
  uVar3 = arrays_->groups_size_mask;
  pgVar4 = arrays_->groups_;
  lVar12 = 1;
  while( true ) {
    pgVar1 = pgVar4 + pos0;
    pgVar2 = pgVar4 + pos0;
    bVar8 = pgVar2->m[0xf].n;
    auVar13[0] = -(pgVar2->m[0].n == '\0');
    auVar13[1] = -(pgVar2->m[1].n == '\0');
    auVar13[2] = -(pgVar2->m[2].n == '\0');
    auVar13[3] = -(pgVar2->m[3].n == '\0');
    auVar13[4] = -(pgVar2->m[4].n == '\0');
    auVar13[5] = -(pgVar2->m[5].n == '\0');
    auVar13[6] = -(pgVar2->m[6].n == '\0');
    auVar13[7] = -(pgVar2->m[7].n == '\0');
    auVar13[8] = -(pgVar2->m[8].n == '\0');
    auVar13[9] = -(pgVar2->m[9].n == '\0');
    auVar13[10] = -(pgVar2->m[10].n == '\0');
    auVar13[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar13[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar13[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar13[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar13[0xf] = -(bVar8 == 0);
    uVar7 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    if (uVar7 != 0) break;
    pgVar1->m[0xf].n = bVar8 | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar12 & uVar3;
    lVar12 = lVar12 + 1;
  }
  uVar6 = 0;
  if (uVar7 != 0) {
    for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
    }
  }
  ppVar5 = arrays_->elements_;
  ppVar5[pos0 * 0xf + (ulong)uVar6].first.savedHash = args_1->savedHash;
  ppCVar9 = (args_1->paramValues)._M_ptr;
  sVar10 = (args_1->paramValues)._M_extent._M_extent_value;
  sVar11 = (args_1->typeParams)._M_extent._M_extent_value;
  ppVar5[pos0 * 0xf + (ulong)uVar6].first.typeParams._M_ptr = (args_1->typeParams)._M_ptr;
  ppVar5[pos0 * 0xf + (ulong)uVar6].first.typeParams._M_extent._M_extent_value = sVar11;
  ppVar5[pos0 * 0xf + (ulong)uVar6].first.paramValues._M_ptr = ppCVar9;
  ppVar5[pos0 * 0xf + (ulong)uVar6].first.paramValues._M_extent._M_extent_value = sVar10;
  ppVar5[pos0 * 0xf + (ulong)uVar6].second = &(*args_2)->super_Type;
  pgVar1->m[uVar6].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar6;
  __return_storage_ptr__->p = ppVar5 + pos0 * 0xf + (ulong)uVar6;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }